

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError MuxGetFrameInternal(WebPMuxImage *wpi,WebPMuxFrameInfo *frame)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  WebPChunkId WVar4;
  long in_RSI;
  long *in_RDI;
  WebPData *unaff_retaddr;
  WebPMuxImage *in_stack_00000008;
  uint8_t bits;
  WebPData *frame_data;
  int is_frame;
  WebPMuxError local_4;
  
  if (*(uint32_t *)*in_RDI == 0x464d4e41) {
    lVar2 = *in_RDI;
    if (*(ulong *)(lVar2 + 0x10) < 0x10) {
      local_4 = WEBP_MUX_BAD_DATA;
    }
    else {
      iVar3 = GetLE24((uint8_t *)0x1a7635);
      *(int *)(in_RSI + 0x10) = iVar3 << 1;
      iVar3 = GetLE24((uint8_t *)0x1a7652);
      *(int *)(in_RSI + 0x14) = iVar3 << 1;
      bVar1 = *(byte *)(*(long *)(lVar2 + 8) + 0xf);
      iVar3 = GetLE24((uint8_t *)0x1a767e);
      *(int *)(in_RSI + 0x18) = iVar3;
      *(uint *)(in_RSI + 0x20) = (uint)((bVar1 & 1) != 0);
      *(uint *)(in_RSI + 0x24) = (uint)((bVar1 & 2) != 0);
      WVar4 = ChunkGetIdFromTag(*(uint32_t *)*in_RDI);
      *(WebPChunkId *)(in_RSI + 0x1c) = WVar4;
      local_4 = SynthesizeBitstream(in_stack_00000008,unaff_retaddr);
    }
  }
  else {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  return local_4;
}

Assistant:

static WebPMuxError MuxGetFrameInternal(const WebPMuxImage* const wpi,
                                        WebPMuxFrameInfo* const frame) {
  const int is_frame = (wpi->header_->tag_ == kChunks[IDX_ANMF].tag);
  const WebPData* frame_data;
  if (!is_frame) return WEBP_MUX_INVALID_ARGUMENT;
  assert(wpi->header_ != NULL);  // Already checked by WebPMuxGetFrame().
  // Get frame chunk.
  frame_data = &wpi->header_->data_;
  if (frame_data->size < kChunks[IDX_ANMF].size) return WEBP_MUX_BAD_DATA;
  // Extract info.
  frame->x_offset = 2 * GetLE24(frame_data->bytes + 0);
  frame->y_offset = 2 * GetLE24(frame_data->bytes + 3);
  {
    const uint8_t bits = frame_data->bytes[15];
    frame->duration = GetLE24(frame_data->bytes + 12);
    frame->dispose_method =
        (bits & 1) ? WEBP_MUX_DISPOSE_BACKGROUND : WEBP_MUX_DISPOSE_NONE;
    frame->blend_method = (bits & 2) ? WEBP_MUX_NO_BLEND : WEBP_MUX_BLEND;
  }
  frame->id = ChunkGetIdFromTag(wpi->header_->tag_);
  return SynthesizeBitstream(wpi, &frame->bitstream);
}